

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.hpp
# Opt level: O3

int __thiscall
Centaurus::NFA<wchar_t>::select
          (NFA<wchar_t> *this,int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds,
          timeval *__timeout)

{
  pointer pNVar1;
  int extraout_EAX;
  int iVar2;
  undefined4 in_register_00000034;
  long lVar3;
  NFABaseState<wchar_t,_int> *src;
  NFABaseState<wchar_t,_int> *pNVar4;
  NFABaseState<wchar_t,_int> local_60;
  NFA<wchar_t> *local_38;
  
  lVar3 = CONCAT44(in_register_00000034,__nfds);
  pNVar4 = (this->super_NFABase<Centaurus::NFABaseState<wchar_t,_int>_>).m_states.
           super__Vector_base<Centaurus::NFABaseState<wchar_t,_int>,_std::allocator<Centaurus::NFABaseState<wchar_t,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_60._vptr_NFABaseState = (_func_int **)&PTR__CharClass_0019e4f8;
  local_60.m_transitions.
  super__Vector_base<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_60.m_transitions.
  super__Vector_base<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_60.m_transitions.
  super__Vector_base<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar2 = (int)((ulong)((long)(this->super_NFABase<Centaurus::NFABaseState<wchar_t,_int>_>).m_states
                              .
                              super__Vector_base<Centaurus::NFABaseState<wchar_t,_int>,_std::allocator<Centaurus::NFABaseState<wchar_t,_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar4) >> 3) *
          -0x33333333;
  NFABaseState<wchar_t,_int>::add_transition(pNVar4,(CharClass<wchar_t> *)&local_60,iVar2,false);
  local_60._vptr_NFABaseState = (_func_int **)&PTR__CharClass_0019e4f8;
  std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>::~vector
            ((vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_> *)
             &local_60.m_transitions);
  src = *(NFABaseState<wchar_t,_int> **)(lVar3 + 8);
  iVar2 = iVar2 + -1;
  pNVar4 = src + 1;
  if (pNVar4 != *(NFABaseState<wchar_t,_int> **)(lVar3 + 0x10)) {
    local_38 = this;
    do {
      NFABaseState<wchar_t,_int>::offset(&local_60,pNVar4,iVar2);
      std::
      vector<Centaurus::NFABaseState<wchar_t,int>,std::allocator<Centaurus::NFABaseState<wchar_t,int>>>
      ::emplace_back<Centaurus::NFABaseState<wchar_t,int>>
                ((vector<Centaurus::NFABaseState<wchar_t,int>,std::allocator<Centaurus::NFABaseState<wchar_t,int>>>
                  *)&(this->super_NFABase<Centaurus::NFABaseState<wchar_t,_int>_>).m_states,
                 &local_60);
      local_60._vptr_NFABaseState = (_func_int **)&PTR__NFABaseState_0019f928;
      std::
      vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
      ::~vector(&local_60.m_transitions);
      pNVar4 = pNVar4 + 1;
    } while (pNVar4 != *(NFABaseState<wchar_t,_int> **)(lVar3 + 0x10));
    src = *(NFABaseState<wchar_t,_int> **)(lVar3 + 8);
    this = local_38;
  }
  NFABaseState<wchar_t,_int>::rebase_transitions
            ((this->super_NFABase<Centaurus::NFABaseState<wchar_t,_int>_>).m_states.
             super__Vector_base<Centaurus::NFABaseState<wchar_t,_int>,_std::allocator<Centaurus::NFABaseState<wchar_t,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start,src,iVar2);
  local_60._vptr_NFABaseState = (_func_int **)&PTR__CharClass_0019e4f8;
  local_60.m_transitions.
  super__Vector_base<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_60.m_transitions.
  super__Vector_base<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_60.m_transitions.
  super__Vector_base<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  add_state(this,(CharClass<wchar_t> *)&local_60);
  local_60._vptr_NFABaseState = (_func_int **)&PTR__CharClass_0019e4f8;
  std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>::~vector
            ((vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_> *)
             &local_60.m_transitions);
  local_60._vptr_NFABaseState = (_func_int **)&PTR__CharClass_0019e4f8;
  local_60.m_transitions.
  super__Vector_base<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_60.m_transitions.
  super__Vector_base<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_60.m_transitions.
  super__Vector_base<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pNVar1 = (this->super_NFABase<Centaurus::NFABaseState<wchar_t,_int>_>).m_states.
           super__Vector_base<Centaurus::NFABaseState<wchar_t,_int>,_std::allocator<Centaurus::NFABaseState<wchar_t,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  NFABaseState<wchar_t,_int>::add_transition
            (pNVar1 + iVar2,(CharClass<wchar_t> *)&local_60,
             (int)((ulong)((long)(this->super_NFABase<Centaurus::NFABaseState<wchar_t,_int>_>).
                                 m_states.
                                 super__Vector_base<Centaurus::NFABaseState<wchar_t,_int>,_std::allocator<Centaurus::NFABaseState<wchar_t,_int>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar1) >> 3) *
             -0x33333333 + -1,false);
  local_60._vptr_NFABaseState = (_func_int **)&PTR__CharClass_0019e4f8;
  std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>::~vector
            ((vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_> *)
             &local_60.m_transitions);
  return extraout_EAX;
}

Assistant:

CharClass(Stream& stream)
    {
        parse(stream);
    }